

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

Result __thiscall spectest::JSONParser::ParseActionResult(JSONParser *this)

{
  bool bVar1;
  Result result;
  undefined1 local_38 [8];
  TypeVector expected;
  JSONParser *this_local;
  
  expected.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = ExpectKey(this,"expected");
  bVar1 = wabt::Failed(expected.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._4_4_);
  if (bVar1) {
    wabt::Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_38);
    result = ParseTypeVector(this,(TypeVector *)local_38);
    bVar1 = wabt::Failed(result);
    if (bVar1) {
      wabt::Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      wabt::Result::Result((Result *)((long)&this_local + 4),Ok);
    }
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_38);
  }
  return (Result)this_local._4_4_;
}

Assistant:

wabt::Result JSONParser::ParseActionResult() {
  // Not needed for wabt-interp, but useful for other parsers.
  EXPECT_KEY("expected");
  TypeVector expected;
  CHECK_RESULT(ParseTypeVector(&expected));
  return wabt::Result::Ok;
}